

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSemi.c
# Opt level: O3

int Ssw_ManFilterBmc(Ssw_Sem_t *pBmc,int iPat,int fCheckTargets)

{
  Ssw_Man_t *p;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Aig_Man_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  Aig_Obj_t *p1;
  ulong uVar14;
  Aig_Obj_t *pAVar15;
  ulong uVar16;
  int iVar17;
  timespec ts;
  timespec local_40;
  
  p = pBmc->pMan;
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pAVar7 = Aig_ManStart(p->pAig->vObjs->nSize * 3);
  p->pFrames = pAVar7;
  pAVar7 = p->pAig;
  if (0 < pAVar7->nRegs) {
    lVar13 = 0;
    do {
      uVar14 = (ulong)(uint)pAVar7->nTruePis + lVar13;
      iVar4 = (int)uVar14;
      if (((iVar4 < 0) || (pAVar7->vCis->nSize <= iVar4)) || (pBmc->vPatterns->nSize <= lVar13)) {
LAB_006234ea:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p->pNodeToFrames
      [(long)*(int *)((long)pAVar7->vCis->pArray[uVar14 & 0xffffffff] + 0x24) * (long)p->nFrames] =
           (Aig_Obj_t *)
           ((ulong)((*(uint *)((long)pBmc->vPatterns->pArray[lVar13] + (long)(iPat >> 5) * 4) >>
                     (iPat & 0x1fU) & 1) == 0) ^ (ulong)p->pFrames->pConst1);
      lVar13 = lVar13 + 1;
      pAVar7 = p->pAig;
    } while (lVar13 < pAVar7->nRegs);
  }
  iVar4 = pBmc->nFramesSweep;
  if (0 < iVar4) {
    bVar2 = false;
    iVar6 = 0;
    do {
      p->pNodeToFrames[pAVar7->pConst1->Id * p->nFrames + iVar6] = p->pFrames->pConst1;
      pAVar7 = p->pAig;
      if (0 < pAVar7->nTruePis) {
        lVar13 = 0;
        do {
          if (pAVar7->vCis->nSize <= lVar13) goto LAB_006234ea;
          pvVar1 = pAVar7->vCis->pArray[lVar13];
          pAVar8 = Aig_ObjCreateCi(p->pFrames);
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar6] = pAVar8;
          lVar13 = lVar13 + 1;
          pAVar7 = p->pAig;
        } while (lVar13 < pAVar7->nTruePis);
      }
      pVVar9 = pAVar7->vObjs;
      if (0 < pVVar9->nSize) {
        lVar13 = 0;
        do {
          pAVar8 = (Aig_Obj_t *)pVVar9->pArray[lVar13];
          if ((pAVar8 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar8->field_0x18 & 7) - 7))
          {
            if (((ulong)pAVar8 & 1) != 0) goto LAB_00623509;
            uVar14 = (ulong)pAVar8->pFanin0 & 0xfffffffffffffffe;
            if (uVar14 == 0) {
              pAVar15 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar15 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar8->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar14 + 0x24) * p->nFrames + iVar6]);
            }
            uVar14 = (ulong)pAVar8->pFanin1 & 0xfffffffffffffffe;
            if (uVar14 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar8->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[*(int *)(uVar14 + 0x24) * p->nFrames + iVar6]);
            }
            pAVar15 = Aig_And(p->pFrames,pAVar15,p1);
            p->pNodeToFrames[pAVar8->Id * p->nFrames + iVar6] = pAVar15;
            iVar5 = Ssw_ManSweepNode(p,pAVar8,iVar6,1,(Vec_Int_t *)0x0);
            if (iVar5 != 0) {
              Ssw_ManFilterBmcSavePattern(pBmc);
              bVar3 = !bVar2;
              bVar2 = true;
              if (bVar3) {
                pBmc->nConfMax = pBmc->nConfMax * 10;
              }
            }
            if ((iVar6 != 0) && ((long)pBmc->nConfMax <= (p->pMSat->pSat->stats).conflicts)) {
              iVar4 = -1;
              break;
            }
          }
          lVar13 = lVar13 + 1;
          pVVar9 = p->pAig->vObjs;
        } while (lVar13 < pVVar9->nSize);
      }
      if ((long)pBmc->nConfMax <= (p->pMSat->pSat->stats).conflicts) {
        iVar4 = iVar4 + iVar6 + 1;
        break;
      }
      if ((fCheckTargets != 0) && (iVar5 = Ssw_SemCheckTargets(pBmc), iVar5 != 0)) break;
      pAVar7 = p->pAig;
      iVar5 = iVar6 + 1;
      if (0 < pAVar7->nRegs) {
        iVar17 = 0;
        do {
          uVar11 = pAVar7->nTruePos + iVar17;
          if (((((int)uVar11 < 0) || (pAVar7->vCos->nSize <= (int)uVar11)) ||
              (uVar10 = pAVar7->nTruePis + iVar17, (int)uVar10 < 0)) ||
             (pAVar7->vCis->nSize <= (int)uVar10)) goto LAB_006234ea;
          pvVar1 = pAVar7->vCos->pArray[uVar11];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_00623509:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar14 = *(ulong *)((long)pvVar1 + 8);
          uVar16 = uVar14 & 0xfffffffffffffffe;
          if (uVar16 == 0) {
            pAVar8 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar8 = (Aig_Obj_t *)
                     ((ulong)((uint)uVar14 & 1) ^
                     (ulong)p->pNodeToFrames[*(int *)(uVar16 + 0x24) * p->nFrames + iVar6]);
          }
          p->pNodeToFrames[p->nFrames * *(int *)((long)pAVar7->vCis->pArray[uVar10] + 0x24) + iVar5]
               = pAVar8;
          Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar8 & 0xfffffffffffffffe));
          iVar17 = iVar17 + 1;
          pAVar7 = p->pAig;
        } while (iVar17 < pAVar7->nRegs);
      }
      iVar6 = iVar5;
    } while (iVar5 < pBmc->nFramesSweep);
    if (bVar2) {
      pBmc->nConfMax = pBmc->nConfMax / 10;
    }
  }
  Ssw_ClassesCheck(p->ppClasses);
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeBmc = p->timeBmc + lVar13 + lVar12;
  return iVar4;
}

Assistant:

int Ssw_ManFilterBmc( Ssw_Sem_t * pBmc, int iPat, int fCheckTargets )
{
    Ssw_Man_t * p = pBmc->pMan;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    unsigned * pInfo;
    int i, f, RetValue, fFirst = 0;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * 3 );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( pBmc->vPatterns, i );
        pObjNew = Aig_NotCond( Aig_ManConst1(p->pFrames), !Abc_InfoHasBit(pInfo, iPat) );
        Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
    }

    // sweep internal nodes
    RetValue = pBmc->nFramesSweep;
    for ( f = 0; f < pBmc->nFramesSweep; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            if ( Ssw_ManSweepNode( p, pObj, f, 1, NULL ) )
            {
                Ssw_ManFilterBmcSavePattern( pBmc );
                if ( fFirst == 0 )
                {
                    fFirst = 1;
                    pBmc->nConfMax *= 10;
                }
            }
            if ( f > 0 && p->pMSat->pSat->stats.conflicts >= pBmc->nConfMax )
            {
                RetValue = -1;
                break;
            }
        }
        // quit if this is the last timeframe
        if ( p->pMSat->pSat->stats.conflicts >= pBmc->nConfMax )
        {
            RetValue += f + 1;
            break;
        }
        if ( fCheckTargets && Ssw_SemCheckTargets( pBmc ) )
            break;
        // transfer latch input to the latch outputs 
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjChild0Fra(p, pObjLi,f);
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );
        }
//Abc_Print( 1, "Frame %2d : Conflicts = %6d. \n", f, p->pSat->stats.conflicts );
    }
    if ( fFirst )
        pBmc->nConfMax /= 10;

    // cleanup
    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return RetValue;
}